

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O1

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  JBLOCKROW paJVar5;
  jpeg_error_mgr *pjVar6;
  bool bVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uchar *st;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[3].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar1 = (int *)((long)&pjVar4[3].start_pass + 4);
    *piVar1 = *piVar1 + -1;
  }
  if (pjVar4[1].insufficient_data != -1) {
    bVar2 = (byte)cinfo->Al;
    paJVar5 = *MCU_data;
    uVar12 = cinfo->Se;
    if (0 < (int)uVar12) {
      do {
        if ((*paJVar5)[jpeg_natural_order[uVar12]] != 0) goto LAB_0012dd7e;
        bVar7 = 1 < (int)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar7);
      uVar12 = 0;
    }
LAB_0012dd7e:
    iVar15 = cinfo->Ss;
    if (iVar15 <= cinfo->Se) {
      iVar3 = cinfo->cur_comp_info[0]->ac_tbl_no;
      do {
        lVar14 = *(long *)(&pjVar4[8].insufficient_data + (long)iVar3 * 2);
        lVar13 = (long)(iVar15 * 3 + -3);
        if (((int)uVar12 < iVar15) &&
           (iVar10 = arith_decode(cinfo,(uchar *)(lVar14 + lVar13)), iVar10 != 0)) {
          return 1;
        }
        st = (uchar *)(lVar14 + lVar13 + 2);
        lVar14 = 0;
        while( true ) {
          iVar10 = jpeg_natural_order[iVar15 + lVar14];
          sVar9 = (short)(1 << (bVar2 & 0x1f));
          sVar8 = (short)(-1 << (bVar2 & 0x1f));
          if ((*paJVar5)[iVar10] != 0) break;
          iVar11 = arith_decode(cinfo,st + -1);
          if (iVar11 != 0) {
            iVar11 = arith_decode(cinfo,(uchar *)(pjVar4 + 0xe));
            if (iVar11 != 0) {
              sVar9 = sVar8;
            }
            (*paJVar5)[iVar10] = sVar9;
            goto LAB_0012ded5;
          }
          lVar13 = iVar15 + lVar14;
          lVar14 = lVar14 + 1;
          st = st + 3;
          if (cinfo->Se <= lVar13) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x7e;
            (*pjVar6->emit_message)((j_common_ptr)cinfo,-1);
            pjVar4[1].insufficient_data = -1;
            return 1;
          }
        }
        iVar11 = arith_decode(cinfo,st);
        if (iVar11 != 0) {
          if (-1 < (*paJVar5)[iVar10]) {
            sVar8 = sVar9;
          }
          (*paJVar5)[iVar10] = (*paJVar5)[iVar10] + sVar8;
        }
LAB_0012ded5:
        iVar10 = iVar15 + (int)lVar14;
        iVar15 = iVar15 + (int)lVar14 + 1;
      } while (iVar10 < cinfo->Se);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Se = cinfo->Se;
  int p1 = 1 << cinfo->Al;        /* 1 in the bit position being coded */
  int m1 = (NEG_1) << cinfo->Al;  /* -1 in the bit position being coded */
  register int s, k, r;
  unsigned int EOBRUN;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl *tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
        HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
        r = s >> 4;
        s &= 15;
        if (s) {
          if (s != 1)           /* size of new coef should always be 1 */
            WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
          CHECK_BIT_BUFFER(br_state, 1, goto undoit);
          if (GET_BITS(1))
            s = p1;             /* newly nonzero coef is positive */
          else
            s = m1;             /* newly nonzero coef is negative */
        } else {
          if (r != 15) {
            EOBRUN = 1 << r;    /* EOBr, run length is 2^r + appended bits */
            if (r) {
              CHECK_BIT_BUFFER(br_state, r, goto undoit);
              r = GET_BITS(r);
              EOBRUN += r;
            }
            break;              /* rest of block is handled by EOB logic */
          }
          /* note s = 0 for processing ZRL */
        }
        /* Advance over already-nonzero coefs and r still-zero coefs,
         * appending correction bits to the nonzeroes.  A correction bit is 1
         * if the absolute value of the coefficient must be increased.
         */
        do {
          thiscoef = *block + jpeg_natural_order[k];
          if (*thiscoef != 0) {
            CHECK_BIT_BUFFER(br_state, 1, goto undoit);
            if (GET_BITS(1)) {
              if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
                if (*thiscoef >= 0)
                  *thiscoef += p1;
                else
                  *thiscoef += m1;
              }
            }
          } else {
            if (--r < 0)
              break;            /* reached target zero coefficient */
          }
          k++;
        } while (k <= Se);
        if (s) {
          int pos = jpeg_natural_order[k];
          /* Output newly nonzero coefficient */
          (*block)[pos] = (JCOEF)s;
          /* Remember its position in case we have to suspend */
          newnz_pos[num_newnz++] = pos;
        }
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
        thiscoef = *block + jpeg_natural_order[k];
        if (*thiscoef != 0) {
          CHECK_BIT_BUFFER(br_state, 1, goto undoit);
          if (GET_BITS(1)) {
            if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
              if (*thiscoef >= 0)
                *thiscoef += p1;
              else
                *thiscoef += m1;
            }
          }
        }
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}